

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int mbedtls_pk_write_pubkey_pem(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  size_t local_860;
  size_t olen;
  uchar output_buf [2086];
  int ret;
  size_t size_local;
  uchar *buf_local;
  mbedtls_pk_context *key_local;
  
  stack0xffffffffffffffd4 = 0xffffff92;
  local_860 = 0;
  register0x00000000 = mbedtls_pk_write_pubkey_der(key,(uchar *)&olen,0x826);
  key_local._4_4_ = register0x00000000;
  if ((-1 < register0x00000000) &&
     (key_local._4_4_ =
           mbedtls_pem_write_buffer
                     ("-----BEGIN PUBLIC KEY-----\n","-----END PUBLIC KEY-----\n",
                      output_buf + (0x81e - (long)register0x00000000),(long)register0x00000000,buf,
                      size,&local_860), key_local._4_4_ == 0)) {
    key_local._4_4_ = 0;
  }
  return key_local._4_4_;
}

Assistant:

int mbedtls_pk_write_pubkey_pem( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char output_buf[PUB_DER_MAX_BYTES];
    size_t olen = 0;

    PK_VALIDATE_RET( key != NULL );
    PK_VALIDATE_RET( buf != NULL || size == 0 );

    if( ( ret = mbedtls_pk_write_pubkey_der( key, output_buf,
                                     sizeof(output_buf) ) ) < 0 )
    {
        return( ret );
    }

    if( ( ret = mbedtls_pem_write_buffer( PEM_BEGIN_PUBLIC_KEY, PEM_END_PUBLIC_KEY,
                                  output_buf + sizeof(output_buf) - ret,
                                  ret, buf, size, &olen ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}